

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O2

Promise<void> __thiscall
capnproto_test::capnp::test::TestPipeline::Server::dispatchCallInternal
          (Server *this,uint16_t methodId,CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  long lVar1;
  int iVar2;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  undefined6 in_register_00000032;
  Promise<void> PVar4;
  PromiseNode *pPVar3;
  
  lVar1 = *(long *)CONCAT62(in_register_00000032,methodId);
  iVar2 = (int)context.hook;
  if (iVar2 == 2) {
    (**(code **)(lVar1 + 0x18))(this);
    pPVar3 = extraout_RDX_01;
  }
  else if (iVar2 == 1) {
    (**(code **)(lVar1 + 0x10))(this);
    pPVar3 = extraout_RDX_00;
  }
  else if (iVar2 == 0) {
    (**(code **)(lVar1 + 8))(this);
    pPVar3 = extraout_RDX;
  }
  else {
    PVar4 = ::capnp::Capability::Server::internalUnimplemented
                      ((Server *)this,
                       (char *)((long)CONCAT62(in_register_00000032,methodId) +
                               *(long *)(lVar1 + -0x18)),0x314742,0x4cd0);
    pPVar3 = PVar4.super_PromiseBase.node.ptr;
  }
  PVar4.super_PromiseBase.node.ptr = pPVar3;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar4.super_PromiseBase.node;
}

Assistant:

::kj::Promise<void> TestPipeline::Server::dispatchCallInternal(
    uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (methodId) {
    case 0:
      return getCap(::capnp::Capability::Server::internalGetTypedContext<
           ::capnproto_test::capnp::test::TestPipeline::GetCapParams,  ::capnproto_test::capnp::test::TestPipeline::GetCapResults>(context));
    case 1:
      return testPointers(::capnp::Capability::Server::internalGetTypedContext<
           ::capnproto_test::capnp::test::TestPipeline::TestPointersParams,  ::capnproto_test::capnp::test::TestPipeline::TestPointersResults>(context));
    case 2:
      return getAnyCap(::capnp::Capability::Server::internalGetTypedContext<
           ::capnproto_test::capnp::test::TestPipeline::GetAnyCapParams,  ::capnproto_test::capnp::test::TestPipeline::GetAnyCapResults>(context));
    default:
      (void)context;
      return ::capnp::Capability::Server::internalUnimplemented(
          "capnp/test.capnp:TestPipeline",
          0xa5a404caa61d4cd0ull, methodId);
  }
}